

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:186:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:186:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::String> *pEVar1;
  Type *func;
  unsigned_long *in_RCX;
  String local_618;
  ExceptionOr<kj::String> local_600;
  unsigned_long *local_480;
  unsigned_long *depValue;
  ExceptionOr<kj::String> local_320;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<unsigned_long> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:186:11),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)output;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_480 = readMaybe<unsigned_long>
                          ((Maybe<unsigned_long> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_480 != (unsigned_long *)0x0) {
      func = (Type *)mv<unsigned_long>(local_480);
      MaybeVoidCaller<unsigned_long,kj::String>::
      apply<kj::(anonymous_namespace)::TestCase170::run()::__3>
                (&local_618,(MaybeVoidCaller<unsigned_long,kj::String> *)&this->func,func,in_RCX);
      handle(&local_600,this,&local_618);
      pEVar1 = ExceptionOrValue::as<kj::String>((ExceptionOrValue *)depResult.value.ptr.field_1);
      ExceptionOr<kj::String>::operator=(pEVar1,&local_600);
      ExceptionOr<kj::String>::~ExceptionOr(&local_600);
      String::~String(&local_618);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x28,in)
    ;
    handle(&local_320,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::String>((ExceptionOrValue *)depResult.value.ptr.field_1);
    ExceptionOr<kj::String>::operator=(pEVar1,&local_320);
    ExceptionOr<kj::String>::~ExceptionOr(&local_320);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<unsigned_long>::~ExceptionOr((ExceptionOr<unsigned_long> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }